

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

RandomBotStrategy * __thiscall
RandomBotStrategy::operator=(RandomBotStrategy *this,RandomBotStrategy *rhs)

{
  code *pcVar1;
  string *this_00;
  allocator<char> local_19;
  RandomBotStrategy *local_18;
  RandomBotStrategy *rhs_local;
  RandomBotStrategy *this_local;
  
  (this->super_PlayerStrategy).exchangingCardType = (rhs->super_PlayerStrategy).exchangingCardType;
  (this->super_PlayerStrategy).armiesToPlace = (rhs->super_PlayerStrategy).armiesToPlace;
  (this->super_PlayerStrategy).player = (rhs->super_PlayerStrategy).player;
  (this->super_PlayerStrategy).from = (rhs->super_PlayerStrategy).from;
  (this->super_PlayerStrategy).to = (rhs->super_PlayerStrategy).to;
  local_18 = rhs;
  rhs_local = this;
  this_00 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"RANDOM",&local_19);
  (this->super_PlayerStrategy).strategyName = this_00;
  std::allocator<char>::~allocator(&local_19);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RandomBotStrategy& RandomBotStrategy::operator=(const RandomBotStrategy& rhs) {
    this->exchangingCardType = rhs.exchangingCardType;
    this->armiesToPlace = rhs.armiesToPlace;
    this->player = rhs.player;
    this->from = rhs.from;
    this->to = rhs.to;
    this->strategyName = new std::string("RANDOM");
}